

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O3

void __thiscall
ElementsAddressFactory_Constructor_type_witver_prefix_Test::
~ElementsAddressFactory_Constructor_type_witver_prefix_Test
          (ElementsAddressFactory_Constructor_type_witver_prefix_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ElementsAddressFactory, Constructor_type_witver_prefix)
{
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kMainnet, WitnessVersion::kVersion0, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kTestnet, WitnessVersion::kVersion1, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kRegtest, WitnessVersion::kVersionNone, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kLiquidV1, WitnessVersion::kVersion0, GetElementsAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kElementsRegtest, WitnessVersion::kVersionNone, GetElementsAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    ElementsAddressFactory factory(NetType::kLiquidV1, WitnessVersion::kVersion0, GetElementsAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kLiquidV1);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, WitnessVersion::kVersionNone, GetElementsAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kElementsRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    ElementsAddressFactory factory(NetType::kMainnet, WitnessVersion::kVersion0, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2wpkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kTestnet, WitnessVersion::kVersion1, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2wpkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest, WitnessVersion::kVersionNone, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}